

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolb.c
# Opt level: O3

int ffg3db(fitsfile *fptr,long group,uchar nulval,LONGLONG ncols,LONGLONG nrows,LONGLONG naxis1,
          LONGLONG naxis2,LONGLONG naxis3,uchar *array,int *anynul,int *status)

{
  long nelem;
  int iVar1;
  long firstelem;
  LONGLONG firstrow;
  long lVar2;
  long lVar3;
  uchar nullvalue;
  fitsfile *local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  char cdummy;
  LONGLONG local_80;
  LONGLONG local_78;
  LONGLONG fpixel [3];
  long inc [3];
  
  inc[0] = 1;
  inc[1] = 1;
  inc[2] = 1;
  fpixel[0] = 1;
  fpixel[1] = 1;
  fpixel[2] = 1;
  local_a8 = naxis1;
  iVar1 = fits_is_compressed_image(fptr,status);
  nelem = local_a8;
  if (iVar1 == 0) {
    firstrow = 1;
    if (1 < group) {
      firstrow = group;
    }
    local_b0 = fptr;
    if (nrows == naxis2 && ncols == local_a8) {
      ffgclb(fptr,2,firstrow,1,nrows * ncols * naxis3,1,1,nulval,array,&cdummy,anynul,status);
      iVar1 = *status;
    }
    else if (nrows < naxis2 || ncols < local_a8) {
      *status = 0x140;
      iVar1 = 0x140;
    }
    else {
      if (0 < naxis3) {
        local_a0 = (nrows - naxis2) * ncols;
        firstelem = 1;
        lVar3 = 0;
        local_90 = (ulong)nulval;
        local_98 = 0;
        do {
          lVar2 = naxis2;
          if (0 < naxis2) {
            do {
              iVar1 = ffgclb(fptr,2,firstrow,firstelem,nelem,1,1,(uchar)local_90,array + lVar3,
                             &cdummy,anynul,status);
              if (0 < iVar1) goto LAB_0014f4b3;
              firstelem = firstelem + nelem;
              lVar3 = lVar3 + ncols;
              lVar2 = lVar2 + -1;
              fptr = local_b0;
            } while (lVar2 != 0);
          }
          lVar3 = lVar3 + local_a0;
          local_98 = local_98 + 1;
        } while (local_98 != naxis3);
      }
LAB_0014f4b3:
      iVar1 = *status;
    }
  }
  else {
    local_78 = naxis3;
    nullvalue = nulval;
    _cdummy = ncols;
    local_80 = nrows;
    fits_read_compressed_img
              (fptr,0xb,fpixel,(LONGLONG *)&cdummy,inc,1,&nullvalue,array,(char *)0x0,anynul,status)
    ;
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffg3db(fitsfile *fptr,  /* I - FITS file pointer                       */
           long  group,     /* I - group to read (1 = 1st group)           */
           unsigned char nulval, /* set undefined pixels equal to this     */
           LONGLONG  ncols,     /* I - number of pixels in each row of array   */
           LONGLONG  nrows,     /* I - number of rows in each plane of array   */
           LONGLONG  naxis1,    /* I - FITS image NAXIS1 value                 */
           LONGLONG  naxis2,    /* I - FITS image NAXIS2 value                 */
           LONGLONG  naxis3,    /* I - FITS image NAXIS3 value                 */
           unsigned char *array, /* O - array to be filled and returned    */
           int  *anynul,    /* O - set to 1 if any values are null; else 0 */
           int  *status)    /* IO - error status                           */
/*
  Read an entire 3-D array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being read).  Any null
  values in the array will be set equal to the value of nulval, unless
  nulval = 0 in which case no null checking will be performed.
*/
{
    long tablerow, ii, jj;
    LONGLONG narray, nfits;
    char cdummy;
    int  nullcheck = 1;
    long inc[] = {1,1,1};
    LONGLONG fpixel[] = {1,1,1};
    LONGLONG lpixel[3];
    unsigned char nullvalue;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        lpixel[0] = ncols;
        lpixel[1] = nrows;
        lpixel[2] = naxis3;
        nullvalue = nulval;  /* set local variable */

        fits_read_compressed_img(fptr, TBYTE, fpixel, lpixel, inc,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */
    tablerow=maxvalue(1,group);

    if (ncols == naxis1 && nrows == naxis2)  /* arrays have same size? */
    {
       /* all the image pixels are contiguous, so read all at once */
       ffgclb(fptr, 2, tablerow, 1, naxis1 * naxis2 * naxis3, 1, 1, nulval,
               array, &cdummy, anynul, status);
       return(*status);
    }

    if (ncols < naxis1 || nrows < naxis2)
       return(*status = BAD_DIMEN);

    nfits = 1;   /* next pixel in FITS image to read */
    narray = 0;  /* next pixel in output array to be filled */

    /* loop over naxis3 planes in the data cube */
    for (jj = 0; jj < naxis3; jj++)
    {
      /* loop over the naxis2 rows in the FITS image, */
      /* reading naxis1 pixels to each row            */

      for (ii = 0; ii < naxis2; ii++)
      {
       if (ffgclb(fptr, 2, tablerow, nfits, naxis1, 1, 1, nulval,
          &array[narray], &cdummy, anynul, status) > 0)
          return(*status);

       nfits += naxis1;
       narray += ncols;
      }
      narray += (nrows - naxis2) * ncols;
    }

    return(*status);
}